

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCheckTypeDefCircularInternal
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr ctxtType,xmlSchemaTypePtr ancestor)

{
  byte *pbVar1;
  int iVar2;
  xmlNodePtr itemElem;
  
  iVar2 = 0;
  if ((ancestor != (xmlSchemaTypePtr)0x0) && (iVar2 = 0, ancestor->type != XML_SCHEMA_TYPE_BASIC)) {
    if (ctxtType == ancestor) {
      itemElem = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)ctxtType);
      iVar2 = 0xbc1;
      xmlSchemaPCustomErrExt
                (pctxt,XML_SCHEMAP_ST_PROPS_CORRECT_2,(xmlSchemaBasicItemPtr)ctxtType,itemElem,
                 "The definition is circular",(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    }
    else if (((uint)ancestor->flags >> 0x10 & 1) == 0) {
      ancestor->flags = ancestor->flags | 0x10000;
      iVar2 = xmlSchemaCheckTypeDefCircularInternal(pctxt,ctxtType,ancestor->baseType);
      pbVar1 = (byte *)((long)&ancestor->flags + 2);
      *pbVar1 = *pbVar1 ^ 1;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaCheckTypeDefCircularInternal(xmlSchemaParserCtxtPtr pctxt,
			   xmlSchemaTypePtr ctxtType,
			   xmlSchemaTypePtr ancestor)
{
    int ret;

    if ((ancestor == NULL) || (ancestor->type == XML_SCHEMA_TYPE_BASIC))
	return (0);

    if (ctxtType == ancestor) {
	xmlSchemaPCustomErr(pctxt,
	    XML_SCHEMAP_ST_PROPS_CORRECT_2,
	    WXS_BASIC_CAST ctxtType, WXS_ITEM_NODE(ctxtType),
	    "The definition is circular", NULL);
	return (XML_SCHEMAP_ST_PROPS_CORRECT_2);
    }
    if (ancestor->flags & XML_SCHEMAS_TYPE_MARKED) {
	/*
	* Avoid infinite recursion on circular types not yet checked.
	*/
	return (0);
    }
    ancestor->flags |= XML_SCHEMAS_TYPE_MARKED;
    ret = xmlSchemaCheckTypeDefCircularInternal(pctxt, ctxtType,
	ancestor->baseType);
    ancestor->flags ^= XML_SCHEMAS_TYPE_MARKED;
    return (ret);
}